

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  bool bVar1;
  lbool lVar2;
  Size SVar3;
  CRef CVar4;
  Lit *pLVar5;
  vec<Minisat::Lit,_int> *in_RSI;
  Solver *in_RDI;
  CRef cr;
  int j;
  int i;
  Lit p;
  lbool *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  lbool in_stack_ffffffffffffff97;
  Solver *in_stack_ffffffffffffff98;
  Lit in_stack_ffffffffffffffa0;
  int iVar6;
  CRef in_stack_ffffffffffffffc4;
  Lit in_stack_ffffffffffffffc8;
  Lit in_stack_ffffffffffffffcc;
  Lit in_stack_ffffffffffffffd4;
  lbool local_25;
  int local_24;
  int local_20;
  Lit local_1c;
  Solver *this_00;
  bool local_1;
  
  if ((in_RDI->ok & 1U) == 0) {
    local_1 = false;
  }
  else {
    this_00 = in_RDI;
    sort<Minisat::Lit>((vec<Minisat::Lit,_int> *)
                       CONCAT17(in_stack_ffffffffffffff97.value,in_stack_ffffffffffffff90));
    local_24 = 0;
    local_20 = 0;
    local_1c.x = -2;
    while (iVar6 = local_20, SVar3 = vec<Minisat::Lit,_int>::size(in_RSI), iVar6 < SVar3) {
      pLVar5 = vec<Minisat::Lit,_int>::operator[](in_RSI,local_20);
      in_stack_ffffffffffffffd4.x = pLVar5->x;
      local_25 = value(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
      bVar1 = lbool::operator==(&local_25,l_True);
      in_stack_ffffffffffffffa0.x = CONCAT13(1,(int3)in_stack_ffffffffffffffa0.x);
      if (!bVar1) {
        in_stack_ffffffffffffff98 = (Solver *)vec<Minisat::Lit,_int>::operator[](in_RSI,local_20);
        in_stack_ffffffffffffffc8.x = local_1c.x;
        in_stack_ffffffffffffffcc = operator~(local_1c);
        bVar1 = Lit::operator==((Lit *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffcc);
        in_stack_ffffffffffffffa0.x = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa0.x);
      }
      if ((char)((uint)in_stack_ffffffffffffffa0.x >> 0x18) != '\0') {
        return true;
      }
      vec<Minisat::Lit,_int>::operator[](in_RSI,local_20);
      lVar2 = value(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffc4 = CONCAT13(lVar2.value,(int3)in_stack_ffffffffffffffc4);
      bVar1 = lbool::operator!=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff97);
      in_stack_ffffffffffffff97.value = false;
      if (bVar1) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](in_RSI,local_20);
        in_stack_ffffffffffffff97.value = Lit::operator!=(pLVar5,local_1c);
      }
      if ((bool)in_stack_ffffffffffffff97.value != false) {
        pLVar5 = vec<Minisat::Lit,_int>::operator[](in_RSI,local_20);
        iVar6 = local_24;
        local_1c.x = pLVar5->x;
        local_24 = local_24 + 1;
        pLVar5 = vec<Minisat::Lit,_int>::operator[](in_RSI,iVar6);
        pLVar5->x = local_1c.x;
      }
      local_20 = local_20 + 1;
    }
    vec<Minisat::Lit,_int>::shrink(in_RSI,local_20 - local_24);
    SVar3 = vec<Minisat::Lit,_int>::size(in_RSI);
    if (SVar3 == 0) {
      in_RDI->ok = false;
      local_1 = false;
    }
    else {
      SVar3 = vec<Minisat::Lit,_int>::size(in_RSI);
      if (SVar3 == 1) {
        vec<Minisat::Lit,_int>::operator[](in_RSI,0);
        uncheckedEnqueue((Solver *)CONCAT44(in_stack_ffffffffffffffcc.x,in_stack_ffffffffffffffc8.x)
                         ,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc4);
        CVar4 = propagate((Solver *)ps);
        local_1 = CVar4 == 0xffffffff;
        in_RDI->ok = local_1;
      }
      else {
        ClauseAllocator::alloc
                  ((ClauseAllocator *)CONCAT44(iVar6,in_stack_ffffffffffffffa0.x),
                   (vec<Minisat::Lit,_int> *)in_stack_ffffffffffffff98,
                   (bool)in_stack_ffffffffffffff97.value);
        CVar4 = (CRef)((ulong)in_RSI >> 0x20);
        vec<unsigned_int,_int>::push
                  ((vec<unsigned_int,_int> *)
                   CONCAT17(in_stack_ffffffffffffff97.value,in_stack_ffffffffffffff90),
                   (uint *)in_stack_ffffffffffffff88);
        attachClause(this_00,CVar4);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}